

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

CodeLocation __thiscall
soul::SourceCodeUtilities::findEndOfExpression(SourceCodeUtilities *this,CodeLocation *start)

{
  TokenType __s1;
  bool bVar1;
  int iVar2;
  char *extraout_RDX;
  UTF8Reader UVar3;
  char *extraout_RDX_00;
  CodeLocation CVar4;
  SimpleTokeniser tokeniser;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  local_a8;
  
  SimpleTokeniser::SimpleTokeniser((SimpleTokeniser *)&local_a8,start,true);
  if (local_a8.currentType.text != "$eof") {
    do {
      if (local_a8.currentType.text != (char *)0x0) {
        iVar2 = strcmp(local_a8.currentType.text,"$eof");
        if (iVar2 == 0) break;
      }
      bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)&local_a8,(TokenType)0x26375e,(TokenType)0x261d5f,(TokenType)0x286aae,
                         (TokenType)0x26223a);
      __s1.text = local_a8.currentType.text;
      if (bVar1) {
        *(SourceCodeText **)this = local_a8.location.sourceCode.object;
        if (local_a8.location.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_a8.location.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_a8.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        *(char **)(this + 8) = local_a8.location.location.data;
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::~Tokeniser(&local_a8);
        UVar3.data = extraout_RDX_00;
        goto LAB_001b43b0;
      }
      if (local_a8.currentType.text == "(") {
LAB_001b4367:
        bVar1 = SimpleTokeniser::skipPastMatchingCloseDelimiter
                          ((SimpleTokeniser *)&local_a8,(TokenType)0x288ebc,(TokenType)0x286aae);
LAB_001b4389:
        if (bVar1 == false) break;
      }
      else {
        if (local_a8.currentType.text != (char *)0x0) {
          iVar2 = strcmp(local_a8.currentType.text,"(");
          if (iVar2 == 0) goto LAB_001b4367;
        }
        if (__s1.text == "{") {
LAB_001b4377:
          bVar1 = SimpleTokeniser::skipPastMatchingCloseDelimiter
                            ((SimpleTokeniser *)&local_a8,(TokenType)0x263760,(TokenType)0x26223a);
          goto LAB_001b4389;
        }
        if (__s1.text != (char *)0x0) {
          iVar2 = strcmp(__s1.text,"{");
          if (iVar2 == 0) goto LAB_001b4377;
        }
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip(&local_a8);
      }
    } while (local_a8.currentType.text != "$eof");
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::~Tokeniser(&local_a8);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  UVar3.data = extraout_RDX;
LAB_001b43b0:
  CVar4.location.data = UVar3.data;
  CVar4.sourceCode.object = (SourceCodeText *)this;
  return CVar4;
}

Assistant:

CodeLocation SourceCodeUtilities::findEndOfExpression (CodeLocation start)
{
    try
    {
        SimpleTokeniser tokeniser (start, true);

        while (! tokeniser.matches (Token::eof))
        {
            if (tokeniser.matchesAny (Operator::comma, Operator::semicolon, Operator::closeParen, Operator::closeBrace))
                return tokeniser.location;

            if (tokeniser.matches (Operator::openParen))
            {
                if (! tokeniser.skipPastMatchingCloseDelimiter (Operator::openParen, Operator::closeParen))
                    break;
            }
            else if (tokeniser.matches (Operator::openBrace))
            {
                if (! tokeniser.skipPastMatchingCloseDelimiter (Operator::openBrace, Operator::closeBrace))
                    break;
            }
            else
            {
                tokeniser.skip();
            }
        }
    }
    catch (const AbortCompilationException&) {}

    return {};
}